

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::_::UnverifiedConfig> *
kj::_::populateUnverifiedConfig
          (Maybe<kj::_::UnverifiedConfig> *__return_storage_ptr__,Array<kj::_::KeyMaybeVal> *params)

{
  Maybe<kj::ArrayPtr<const_char>_> *pMVar1;
  int iVar2;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *paVar3;
  ulong uVar4;
  long lVar5;
  NullableValue<kj::ArrayPtr<const_char>_> *this;
  NullableValue<kj::ArrayPtr<const_char>_> *other;
  _ local_74 [4];
  ulong local_70;
  UnverifiedConfig config;
  
  if (params->size_ < 5) {
    config.clientNoContextTakeover = false;
    config.serverNoContextTakeover = false;
    config.clientMaxWindowBits.ptr.isSet = false;
    config.serverMaxWindowBits.ptr.isSet = false;
    other = &(params->ptr->val).ptr;
    for (lVar5 = params->size_ * 0x28; lVar5 != 0; lVar5 = lVar5 + -0x28) {
      parseKeyName(local_74,&other[-1].field_1.value);
      if (local_74[0] != (_)0x1) goto LAB_00308cf7;
      iVar2 = (int)local_70;
      if (local_70 >> 0x20 == 1) {
        this = &config.serverMaxWindowBits.ptr;
        uVar4 = 0x20;
        if (iVar2 == 0) {
          this = &config.clientMaxWindowBits.ptr;
          uVar4 = 8;
        }
        if ((&config.clientNoContextTakeover)[uVar4] == true) goto LAB_00308cf7;
        if (other->isSet != true) {
          pMVar1 = &config.serverMaxWindowBits;
          if (iVar2 == 0) {
            pMVar1 = &config.clientMaxWindowBits;
          }
          paVar3 = &(pMVar1->ptr).field_1;
          (paVar3->value).ptr = (char *)0x0;
          (paVar3->value).size_ = 0;
          goto LAB_00308dd1;
        }
        if ((other->field_1).value.size_ == 0) goto LAB_00308cf7;
        NullableValue<kj::ArrayPtr<const_char>_>::operator=(this,other);
      }
      else if ((int)(local_70 >> 0x20) == 0) {
        uVar4 = (ulong)(iVar2 != 0);
        if (((&config.clientNoContextTakeover)[uVar4] == true) || (other->isSet == true))
        goto LAB_00308cf7;
LAB_00308dd1:
        (&config.clientNoContextTakeover)[uVar4] = true;
      }
      other = (NullableValue<kj::ArrayPtr<const_char>_> *)((long)&other[1].field_1 + 8);
    }
    NullableValue<kj::_::UnverifiedConfig>::NullableValue(&__return_storage_ptr__->ptr,&config);
  }
  else {
LAB_00308cf7:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<UnverifiedConfig> populateUnverifiedConfig(kj::Array<KeyMaybeVal>& params) {
  // Given a collection of <key, MaybeValue> pairs, attempt to populate an `UnverifiedConfig` struct.
  // If the struct cannot be populated, we return null.
  //
  // This function populates the struct with what it finds, it does not perform bounds checking or
  // concern itself with valid `Value`s (so long as the `Value` is non-empty).
  //
  // The following issues would prevent a struct from being populated:
  //  Key issues:
  //    - `Key` is invalid (see `parseKeyName()`).
  //    - `Key` is repeated.
  //  Value issues:
  //    - Got a `Value` when none was expected (only the `max_window_bits` parameters expect values).
  //    - Got an empty `Value` (0 characters, or all whitespace characters).

  if (params.size() > 4) {
    // We expect 4 `Key`s at most, having more implies repeats/invalid keys are present.
    return kj::none;
  }

  UnverifiedConfig config;

  for (auto& param : params) {
    KJ_IF_SOME(paramType, parseKeyName(param.key)) {
      // `Key` is valid, but we still want to check for repeats.
      const auto& side = paramType.side;
      const auto& property = paramType.property;

      if (property == ParamType::NO_CONTEXT_TAKEOVER) {
        auto& takeOverSetting = (side == ParamType::CLIENT) ?
            config.clientNoContextTakeover : config.serverNoContextTakeover;

        if (takeOverSetting == true) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        if (param.val != kj::none) {
          // The `x_no_context_takeover` parameter shouldn't have a value; invalid config.
          return kj::none;
        }

        takeOverSetting = true;
      } else if (property == ParamType::MAX_WINDOW_BITS) {
        auto& maxBitsSetting =
            (side == ParamType::CLIENT) ? config.clientMaxWindowBits : config.serverMaxWindowBits;

        if (maxBitsSetting != kj::none) {
          // This `Key` is a repeat; invalid config.
          return kj::none;
        }

        KJ_IF_SOME(value, param.val) {
          if (value.size() == 0) {
            // This is equivalent to `x_max_window_bits=`, since we got an "=" we expected a token
            // to follow.
            return kj::none;
          }
          maxBitsSetting = param.val;
        } else {
          // We know we got this `max_window_bits` parameter in a Request/Response, and we also know
          // that it didn't include an "=" (otherwise the value wouldn't be null).
          // It's important to retain the information that the parameter was received *without* a
          // corresponding value, as this may determine whether the offer is valid or not.
          //
          // To retain this information, we'll set `maxBitsSetting` to be an empty ArrayPtr so this
          // can be dealt with properly later.
          maxBitsSetting = ArrayPtr<const char>();
        }
      }
    } else {
      // Invalid parameter.
      return kj::none;
    }
  }